

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O3

void aom_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  bool bVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [14];
  bool bVar33;
  short *psVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  int *piVar39;
  long lVar40;
  bool bVar41;
  long lVar42;
  undefined1 auVar43 [16];
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  ushort uVar48;
  ushort uVar52;
  ushort uVar53;
  ushort uVar55;
  ushort uVar57;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  ushort uVar60;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined1 auVar62 [16];
  ushort uVar70;
  undefined1 auVar63 [16];
  undefined1 auVar72 [16];
  undefined4 uVar73;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  ushort uVar88;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  undefined2 uVar122;
  undefined2 uVar124;
  undefined2 uVar125;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined2 uVar126;
  undefined1 auVar99 [16];
  ushort uVar123;
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  short sVar127;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  short sVar136;
  ushort uVar137;
  ushort uVar145;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  undefined2 uVar149;
  undefined2 uVar150;
  undefined2 uVar151;
  undefined1 auVar139 [16];
  undefined2 uVar152;
  short sVar154;
  short sVar155;
  undefined1 auVar153 [16];
  undefined4 uVar156;
  undefined1 auVar159 [12];
  short sVar167;
  short sVar168;
  short sVar169;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  ushort uVar173;
  ushort uVar177;
  ushort uVar178;
  ushort uVar179;
  ushort uVar180;
  ushort uVar181;
  ushort uVar182;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  ushort uVar183;
  undefined1 auVar176 [16];
  int local_78;
  int aiStack_74 [11];
  int thresh [4];
  undefined8 uVar49;
  ushort uVar54;
  ushort uVar56;
  ushort uVar58;
  short sVar61;
  short sVar71;
  undefined1 auVar83 [16];
  undefined6 uVar74;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar75 [12];
  undefined1 auVar86 [16];
  undefined1 auVar81 [16];
  undefined1 auVar87 [16];
  undefined1 auVar114 [16];
  undefined1 auVar100 [16];
  undefined1 auVar115 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar101 [16];
  undefined8 uVar89;
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar117 [16];
  undefined1 auVar98 [16];
  undefined1 auVar103 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar118 [16];
  undefined1 auVar128 [12];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar138 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined6 uVar157;
  undefined1 auVar158 [12];
  undefined1 auVar165 [16];
  short sVar166;
  
  lVar42 = 0;
  piVar39 = &local_78;
  bVar33 = true;
  do {
    bVar41 = bVar33;
    *piVar39 = (dequant_ptr[lVar42] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar42] * 0x20 + -1;
    lVar42 = 1;
    piVar39 = aiStack_74;
    bVar33 = false;
  } while (bVar41);
  sVar44 = zbin_ptr[4] + -1;
  sVar45 = zbin_ptr[5] + -1;
  sVar46 = zbin_ptr[6] + -1;
  sVar47 = zbin_ptr[7] + -1;
  auVar90 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar72 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc));
  auVar91._12_2_ = auVar90._0_2_;
  sVar154 = -auVar91._12_2_;
  auVar91._14_2_ = auVar90._2_2_;
  sVar61 = -auVar91._14_2_;
  sVar127 = auVar90._4_2_;
  sVar71 = -sVar127;
  sVar132 = auVar90._6_2_;
  sVar155 = -sVar132;
  sVar133 = auVar90._8_2_;
  sVar135 = -sVar133;
  sVar134 = auVar90._10_2_;
  auVar128._10_2_ = -sVar134;
  sVar166 = auVar90._12_2_;
  sVar169 = -sVar166;
  sVar167 = auVar90._14_2_;
  auVar158._10_2_ = -sVar167;
  uVar48 = (ushort)(sVar154 < auVar91._12_2_) * auVar91._12_2_ |
           (ushort)(sVar154 >= auVar91._12_2_) * sVar154;
  uVar52 = (ushort)(sVar61 < auVar91._14_2_) * auVar91._14_2_ |
           (ushort)(sVar61 >= auVar91._14_2_) * sVar61;
  uVar53 = (ushort)(sVar71 < sVar127) * sVar127 | (ushort)(sVar71 >= sVar127) * sVar71;
  uVar55 = (ushort)(sVar155 < sVar132) * sVar132 | (ushort)(sVar155 >= sVar132) * sVar155;
  uVar49 = CONCAT26(uVar55,CONCAT24(uVar53,CONCAT22(uVar52,uVar48)));
  uVar57 = (ushort)(sVar135 < sVar133) * sVar133 | (ushort)(sVar135 >= sVar133) * sVar135;
  auVar50._0_10_ = CONCAT28(uVar57,uVar49);
  auVar50._10_2_ =
       (ushort)(auVar128._10_2_ < sVar134) * sVar134 |
       (ushort)(auVar128._10_2_ >= sVar134) * auVar128._10_2_;
  auVar50._12_2_ = (ushort)(sVar169 < sVar166) * sVar166 | (ushort)(sVar169 >= sVar166) * sVar169;
  auVar50._14_2_ =
       (ushort)(auVar158._10_2_ < sVar167) * sVar167 |
       (ushort)(auVar158._10_2_ >= sVar167) * auVar158._10_2_;
  auVar91._12_2_ = auVar72._0_2_;
  sVar154 = -auVar91._12_2_;
  auVar91._14_2_ = auVar72._2_2_;
  sVar61 = -auVar91._14_2_;
  sVar127 = auVar72._4_2_;
  sVar71 = -sVar127;
  sVar132 = auVar72._6_2_;
  sVar155 = -sVar132;
  sVar133 = auVar72._8_2_;
  sVar135 = -sVar133;
  sVar134 = auVar72._10_2_;
  auVar128._10_2_ = -sVar134;
  sVar166 = auVar72._12_2_;
  sVar169 = -sVar166;
  sVar167 = auVar72._14_2_;
  auVar158._10_2_ = -sVar167;
  uVar137 = (ushort)(sVar154 < auVar91._12_2_) * auVar91._12_2_ |
            (ushort)(sVar154 >= auVar91._12_2_) * sVar154;
  uVar145 = (ushort)(sVar61 < auVar91._14_2_) * auVar91._14_2_ |
            (ushort)(sVar61 >= auVar91._14_2_) * sVar61;
  uVar146 = (ushort)(sVar71 < sVar127) * sVar127 | (ushort)(sVar71 >= sVar127) * sVar71;
  uVar147 = (ushort)(sVar155 < sVar132) * sVar132 | (ushort)(sVar155 >= sVar132) * sVar155;
  uVar89 = CONCAT26(uVar147,CONCAT24(uVar146,CONCAT22(uVar145,uVar137)));
  uVar148 = (ushort)(sVar135 < sVar133) * sVar133 | (ushort)(sVar135 >= sVar133) * sVar135;
  auVar138._0_10_ = CONCAT28(uVar148,uVar89);
  auVar138._10_2_ =
       (ushort)(auVar128._10_2_ < sVar134) * sVar134 |
       (ushort)(auVar128._10_2_ >= sVar134) * auVar128._10_2_;
  auVar138._12_2_ = (ushort)(sVar169 < sVar166) * sVar166 | (ushort)(sVar169 >= sVar166) * sVar169;
  auVar138._14_2_ =
       (ushort)(auVar158._10_2_ < sVar167) * sVar167 |
       (ushort)(auVar158._10_2_ >= sVar167) * auVar158._10_2_;
  auVar2._10_2_ = 0;
  auVar2._0_10_ = auVar50._0_10_;
  auVar2._12_2_ = uVar55;
  auVar6._8_2_ = uVar53;
  auVar6._0_8_ = uVar49;
  auVar6._10_4_ = auVar2._10_4_;
  auVar29._6_8_ = 0;
  auVar29._0_6_ = auVar6._8_6_;
  auVar11._4_2_ = uVar52;
  auVar11._0_4_ = CONCAT22(uVar52,uVar48);
  auVar11._6_8_ = SUB148(auVar29 << 0x40,6);
  auVar3._10_2_ = 0;
  auVar3._0_10_ = auVar138._0_10_;
  auVar3._12_2_ = uVar147;
  auVar7._8_2_ = uVar146;
  auVar7._0_8_ = uVar89;
  auVar7._10_4_ = auVar3._10_4_;
  auVar30._6_8_ = 0;
  auVar30._0_6_ = auVar7._8_6_;
  auVar12._4_2_ = uVar145;
  auVar12._0_4_ = CONCAT22(uVar145,uVar137);
  auVar12._6_8_ = SUB148(auVar30 << 0x40,6);
  auVar59._0_4_ = -(uint)(local_78 < (int)((uint)uVar48 << 5));
  auVar59._4_4_ = -(uint)(aiStack_74[0] < auVar11._4_4_ << 5);
  auVar59._8_4_ = -(uint)(aiStack_74[0] < auVar6._8_4_ << 5);
  auVar59._12_4_ = -(uint)(aiStack_74[0] < (int)((auVar2._10_4_ >> 0x10) << 5));
  auVar43._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar57 << 5));
  auVar43._4_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar50._10_2_ << 5));
  auVar43._8_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar50._12_2_ << 5));
  auVar43._12_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar50._14_2_ << 5));
  auVar59 = packssdw(auVar59,auVar43);
  auVar62._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar137 << 5));
  auVar62._4_4_ = -(uint)(aiStack_74[0] < auVar12._4_4_ << 5);
  auVar62._8_4_ = -(uint)(aiStack_74[0] < auVar7._8_4_ << 5);
  auVar62._12_4_ = -(uint)(aiStack_74[0] < (int)((auVar3._10_4_ >> 0x10) << 5));
  auVar76._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar148 << 5));
  auVar76._4_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar138._10_2_ << 5));
  auVar76._8_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar138._12_2_ << 5));
  auVar76._12_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar138._14_2_ << 5));
  auVar62 = packssdw(auVar62,auVar76);
  auVar43 = auVar62 | auVar59;
  uVar60 = 0;
  uVar64 = 0;
  uVar65 = 0;
  uVar66 = 0;
  uVar67 = 0;
  uVar68 = 0;
  uVar69 = 0;
  uVar70 = 0;
  bVar26 = (auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar25 = (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar23 = (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar43 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar43 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar43 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar43 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar10 = (auVar43 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar41 = (auVar43 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = auVar43[0xf] < '\0';
  if (((((((((((((((bVar26 || bVar27) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
             bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar10) || bVar41) ||
      bVar33) {
    auVar59 = auVar59 & *(undefined1 (*) [16])iscan;
    auVar62 = auVar62 & *(undefined1 (*) [16])(iscan + 8);
    sVar154 = auVar59._0_2_;
    sVar61 = auVar62._0_2_;
    uVar60 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._2_2_;
    sVar61 = auVar62._2_2_;
    uVar64 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._4_2_;
    sVar61 = auVar62._4_2_;
    uVar65 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._6_2_;
    sVar61 = auVar62._6_2_;
    uVar66 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._8_2_;
    sVar61 = auVar62._8_2_;
    uVar67 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._10_2_;
    sVar61 = auVar62._10_2_;
    uVar68 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._12_2_;
    sVar61 = auVar62._12_2_;
    sVar71 = auVar62._14_2_;
    uVar69 = (ushort)(sVar61 < sVar154) * sVar154 | (ushort)(sVar61 >= sVar154) * sVar61;
    sVar154 = auVar59._14_2_;
    uVar70 = (ushort)(sVar71 < sVar154) * sVar154 | (ushort)(sVar71 >= sVar154) * sVar71;
  }
  bVar33 = ((((((((((((((bVar26 || bVar27) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                  bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar10) ||
           bVar41) || bVar33;
  auVar43 = *(undefined1 (*) [16])round_ptr;
  auVar59 = *(undefined1 (*) [16])quant_ptr;
  auVar62 = *(undefined1 (*) [16])dequant_ptr;
  auVar76 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar170._0_2_ = -(ushort)((short)(*zbin_ptr + -1) < (short)uVar48);
  auVar170._2_2_ = -(ushort)((short)(zbin_ptr[1] + -1) < (short)uVar52);
  auVar170._4_2_ = -(ushort)((short)(zbin_ptr[2] + -1) < (short)uVar53);
  auVar170._6_2_ = -(ushort)((short)(zbin_ptr[3] + -1) < (short)uVar55);
  auVar170._8_2_ = -(ushort)(sVar44 < (short)uVar57);
  auVar170._10_2_ = -(ushort)(sVar45 < (short)auVar50._10_2_);
  auVar170._12_2_ = -(ushort)(sVar46 < (short)auVar50._12_2_);
  auVar170._14_2_ = -(ushort)(sVar47 < (short)auVar50._14_2_);
  auVar174._0_2_ = -(ushort)(sVar44 < (short)uVar137);
  auVar174._2_2_ = -(ushort)(sVar45 < (short)uVar145);
  auVar174._4_2_ = -(ushort)(sVar46 < (short)uVar146);
  auVar174._6_2_ = -(ushort)(sVar47 < (short)uVar147);
  auVar174._8_2_ = -(ushort)(sVar44 < (short)uVar148);
  auVar174._10_2_ = -(ushort)(sVar45 < (short)auVar138._10_2_);
  auVar174._12_2_ = -(ushort)(sVar46 < (short)auVar138._12_2_);
  auVar174._14_2_ = -(ushort)(sVar47 < (short)auVar138._14_2_);
  auVar77 = auVar174 | auVar170;
  bVar27 = (auVar77 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar28 = (auVar77 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar26 = (auVar77 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar25 = (auVar77 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar24 = (auVar77 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar23 = (auVar77 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar22 = (auVar77 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar21 = (auVar77 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar20 = (auVar77 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar19 = (auVar77 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar18 = (auVar77 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar17 = (auVar77 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar16 = (auVar77 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar15 = (auVar77 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar10 = (auVar77 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar41 = -1 < auVar77[0xf];
  auVar63._8_4_ = auVar76._8_4_;
  auVar63._12_4_ = auVar76._12_4_;
  auVar77._0_8_ = auVar43._8_8_;
  auVar78._0_8_ = auVar59._8_8_;
  auVar63._0_8_ = auVar76._8_8_;
  sVar71 = auVar62._12_2_;
  sVar155 = auVar62._14_2_;
  sVar154 = auVar62._8_2_;
  sVar61 = auVar62._10_2_;
  if (((((((((((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) && bVar22) &&
             bVar21) && bVar20) && bVar19) && bVar18) && bVar17) && bVar16) && bVar15) && bVar10) &&
      bVar41) {
    sVar135 = 0;
    uVar122 = 0;
    auVar128._10_2_ = 0;
    uVar124 = 0;
    auVar90._12_2_ = 0;
    uVar125 = 0;
    auVar90._14_2_ = 0;
    uVar126 = 0;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    auVar77._8_4_ = auVar43._8_4_;
    auVar77._12_4_ = auVar43._12_4_;
    auVar78._8_4_ = auVar59._8_4_;
    auVar78._12_4_ = auVar59._12_4_;
    auVar72 = (undefined1  [16])0x0;
    sVar169 = 0;
    uVar149 = 0;
    auVar158._10_2_ = 0;
    uVar150 = 0;
    auVar91._12_2_ = 0;
    uVar151 = 0;
    auVar91._14_2_ = 0;
    uVar152 = 0;
    uVar52 = 0;
    uVar48 = 0;
    uVar53 = 0;
    uVar55 = 0;
    uVar57 = 0;
    uVar137 = 0;
    uVar145 = 0;
    uVar146 = 0;
  }
  else {
    auVar91 = psraw(auVar90,0xf);
    auVar72 = psraw(auVar72,0xf);
    auVar90 = *(undefined1 (*) [16])iscan & auVar170;
    auVar129 = *(undefined1 (*) [16])(iscan + 8) & auVar174;
    sVar135 = auVar90._0_2_;
    auVar128._10_2_ = auVar129._0_2_;
    uVar52 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
             (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._2_2_;
    auVar128._10_2_ = auVar129._2_2_;
    uVar48 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
             (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._4_2_;
    auVar128._10_2_ = auVar129._4_2_;
    uVar53 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
             (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._6_2_;
    auVar128._10_2_ = auVar129._6_2_;
    uVar55 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
             (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._8_2_;
    auVar128._10_2_ = auVar129._8_2_;
    uVar57 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
             (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._10_2_;
    auVar128._10_2_ = auVar129._10_2_;
    uVar137 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
              (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._12_2_;
    auVar128._10_2_ = auVar129._12_2_;
    sVar169 = auVar129._14_2_;
    uVar145 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
              (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
    sVar135 = auVar90._14_2_;
    uVar146 = (ushort)(sVar169 < sVar135) * sVar135 | (ushort)(sVar169 >= sVar135) * sVar169;
    uVar52 = (0 < (short)uVar52) * uVar52;
    uVar48 = (0 < (short)uVar48) * uVar48;
    uVar53 = (0 < (short)uVar53) * uVar53;
    uVar55 = (0 < (short)uVar55) * uVar55;
    uVar57 = (0 < (short)uVar57) * uVar57;
    uVar137 = (0 < (short)uVar137) * uVar137;
    uVar145 = (0 < (short)uVar145) * uVar145;
    uVar146 = (0 < (short)uVar146) * uVar146;
    auVar50 = paddsw(auVar50,auVar43);
    auVar90 = pmulhw(auVar50,auVar59);
    auVar130._0_2_ = auVar90._0_2_ + auVar50._0_2_;
    auVar130._2_2_ = auVar90._2_2_ + auVar50._2_2_;
    auVar130._4_2_ = auVar90._4_2_ + auVar50._4_2_;
    auVar130._6_2_ = auVar90._6_2_ + auVar50._6_2_;
    auVar130._8_2_ = auVar90._8_2_ + auVar50._8_2_;
    auVar130._10_2_ = auVar90._10_2_ + auVar50._10_2_;
    auVar130._12_2_ = auVar90._12_2_ + auVar50._12_2_;
    auVar130._14_2_ = auVar90._14_2_ + auVar50._14_2_;
    auVar50 = pmulhw(auVar130,auVar76);
    auVar77._8_4_ = auVar43._8_4_;
    auVar77._12_4_ = auVar43._12_4_;
    auVar78._8_4_ = auVar59._8_4_;
    auVar78._12_4_ = auVar59._12_4_;
    auVar43 = paddsw(auVar138,auVar77);
    auVar59 = pmulhw(auVar43,auVar78);
    auVar160._0_2_ = auVar59._0_2_ + auVar43._0_2_;
    auVar160._2_2_ = auVar59._2_2_ + auVar43._2_2_;
    auVar160._4_2_ = auVar59._4_2_ + auVar43._4_2_;
    auVar160._6_2_ = auVar59._6_2_ + auVar43._6_2_;
    auVar160._8_2_ = auVar59._8_2_ + auVar43._8_2_;
    auVar160._10_2_ = auVar59._10_2_ + auVar43._10_2_;
    auVar160._12_2_ = auVar59._12_2_ + auVar43._12_2_;
    auVar160._14_2_ = auVar59._14_2_ + auVar43._14_2_;
    auVar43 = pmulhw(auVar160,auVar63);
    auVar50 = auVar50 ^ auVar91;
    auVar131._0_2_ = auVar50._0_2_ - auVar91._0_2_;
    auVar131._2_2_ = auVar50._2_2_ - auVar91._2_2_;
    auVar131._4_2_ = auVar50._4_2_ - auVar91._4_2_;
    auVar131._6_2_ = auVar50._6_2_ - auVar91._6_2_;
    auVar131._8_2_ = auVar50._8_2_ - auVar91._8_2_;
    auVar131._10_2_ = auVar50._10_2_ - auVar91._10_2_;
    auVar131._12_2_ = auVar50._12_2_ - auVar91._12_2_;
    auVar131._14_2_ = auVar50._14_2_ - auVar91._14_2_;
    auVar43 = auVar43 ^ auVar72;
    auVar161._0_2_ = auVar43._0_2_ - auVar72._0_2_;
    auVar161._2_2_ = auVar43._2_2_ - auVar72._2_2_;
    auVar161._4_2_ = auVar43._4_2_ - auVar72._4_2_;
    auVar161._6_2_ = auVar43._6_2_ - auVar72._6_2_;
    auVar161._8_2_ = auVar43._8_2_ - auVar72._8_2_;
    auVar161._10_2_ = auVar43._10_2_ - auVar72._10_2_;
    auVar161._12_2_ = auVar43._12_2_ - auVar72._12_2_;
    auVar161._14_2_ = auVar43._14_2_ - auVar72._14_2_;
    auVar131 = auVar131 & auVar170;
    auVar161 = auVar161 & auVar174;
    auVar43 = psraw(auVar131,0xf);
    auVar129._0_12_ = auVar131._0_12_;
    auVar129._12_2_ = auVar131._6_2_;
    auVar129._14_2_ = auVar43._6_2_;
    auVar94._12_4_ = auVar129._12_4_;
    auVar94._0_10_ = auVar131._0_10_;
    auVar94._10_2_ = auVar43._4_2_;
    auVar93._10_6_ = auVar94._10_6_;
    auVar93._0_8_ = auVar131._0_8_;
    auVar93._8_2_ = auVar131._4_2_;
    auVar92._8_8_ = auVar93._8_8_;
    auVar92._6_2_ = auVar43._2_2_;
    auVar92._4_2_ = auVar131._2_2_;
    auVar92._0_2_ = auVar131._0_2_;
    auVar92._2_2_ = auVar43._0_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar92;
    *(short *)(qcoeff_ptr + 4) = auVar131._8_2_;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar43._8_2_;
    *(short *)(qcoeff_ptr + 5) = auVar131._10_2_;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar43._10_2_;
    *(short *)(qcoeff_ptr + 6) = auVar131._12_2_;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar43._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar131._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar43._14_2_;
    auVar43 = psraw(auVar161,0xf);
    auVar98._0_12_ = auVar161._0_12_;
    auVar98._12_2_ = auVar161._6_2_;
    auVar98._14_2_ = auVar43._6_2_;
    auVar97._12_4_ = auVar98._12_4_;
    auVar97._0_10_ = auVar161._0_10_;
    auVar97._10_2_ = auVar43._4_2_;
    auVar96._10_6_ = auVar97._10_6_;
    auVar96._0_8_ = auVar161._0_8_;
    auVar96._8_2_ = auVar161._4_2_;
    auVar95._8_8_ = auVar96._8_8_;
    auVar95._6_2_ = auVar43._2_2_;
    auVar95._4_2_ = auVar161._2_2_;
    auVar95._0_2_ = auVar161._0_2_;
    auVar95._2_2_ = auVar43._0_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar95;
    *(short *)(qcoeff_ptr + 0xc) = auVar161._8_2_;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar43._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = auVar161._10_2_;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar43._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = auVar161._12_2_;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar43._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = auVar161._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar43._14_2_;
    sVar127 = auVar92._0_2_ * auVar62._0_2_;
    sVar132 = auVar131._2_2_ * auVar62._2_2_;
    uVar73 = CONCAT22(sVar132,sVar127);
    sVar133 = auVar131._4_2_ * auVar62._4_2_;
    uVar74 = CONCAT24(sVar133,uVar73);
    sVar134 = auVar131._6_2_ * auVar62._6_2_;
    uVar49 = CONCAT26(sVar134,uVar74);
    sVar135 = auVar131._8_2_ * sVar154;
    auVar128._0_10_ = CONCAT28(sVar135,uVar49);
    auVar128._10_2_ = auVar131._10_2_ * sVar61;
    auVar90._12_2_ = auVar131._12_2_ * sVar71;
    auVar90._0_12_ = auVar128;
    auVar90._14_2_ = auVar131._14_2_ * sVar155;
    sVar166 = auVar161._2_2_ * sVar61;
    uVar156 = CONCAT22(sVar166,auVar95._0_2_ * sVar154);
    sVar167 = auVar161._4_2_ * sVar71;
    uVar157 = CONCAT24(sVar167,uVar156);
    sVar168 = auVar161._6_2_ * sVar155;
    uVar89 = CONCAT26(sVar168,uVar157);
    sVar169 = auVar161._8_2_ * sVar154;
    auVar158._0_10_ = CONCAT28(sVar169,uVar89);
    auVar158._10_2_ = auVar161._10_2_ * sVar61;
    auVar91._12_2_ = auVar161._12_2_ * sVar71;
    auVar91._0_12_ = auVar158;
    auVar91._14_2_ = auVar161._14_2_ * sVar155;
    auVar43 = psraw(auVar90,0xf);
    auVar144._12_2_ = sVar134;
    auVar144._0_12_ = auVar128;
    auVar144._14_2_ = auVar43._6_2_;
    auVar143._12_4_ = auVar144._12_4_;
    auVar143._10_2_ = auVar43._4_2_;
    auVar143._0_10_ = auVar128._0_10_;
    auVar142._10_6_ = auVar143._10_6_;
    auVar142._8_2_ = sVar133;
    auVar142._0_8_ = uVar49;
    auVar141._8_8_ = auVar142._8_8_;
    auVar141._6_2_ = auVar43._2_2_;
    auVar141._0_6_ = uVar74;
    auVar140._6_10_ = auVar141._6_10_;
    auVar140._4_2_ = sVar132;
    auVar140._0_4_ = uVar73;
    auVar139._4_12_ = auVar140._4_12_;
    auVar139._2_2_ = auVar43._0_2_;
    auVar139._0_2_ = sVar127;
    uVar122 = auVar43._8_2_;
    uVar124 = auVar43._10_2_;
    uVar125 = auVar43._12_2_;
    uVar126 = auVar43._14_2_;
    *(undefined1 (*) [16])dqcoeff_ptr = auVar139;
    auVar43 = psraw(auVar91,0xf);
    auVar103._12_2_ = sVar168;
    auVar103._0_12_ = auVar158;
    auVar103._14_2_ = auVar43._6_2_;
    auVar102._12_4_ = auVar103._12_4_;
    auVar102._10_2_ = auVar43._4_2_;
    auVar102._0_10_ = auVar158._0_10_;
    auVar101._10_6_ = auVar102._10_6_;
    auVar101._8_2_ = sVar167;
    auVar101._0_8_ = uVar89;
    auVar100._8_8_ = auVar101._8_8_;
    auVar100._6_2_ = auVar43._2_2_;
    auVar100._0_6_ = uVar157;
    auVar99._6_10_ = auVar100._6_10_;
    auVar99._4_2_ = sVar166;
    auVar99._0_4_ = uVar156;
    auVar72._4_12_ = auVar99._4_12_;
    auVar72._2_2_ = auVar43._0_2_;
    auVar72._0_2_ = auVar95._0_2_ * sVar154;
    uVar149 = auVar43._8_2_;
    uVar150 = auVar43._10_2_;
    uVar151 = auVar43._12_2_;
    uVar152 = auVar43._14_2_;
  }
  bVar41 = ((((((((((((((!bVar27 || !bVar28) || !bVar26) || !bVar25) || !bVar24) || !bVar23) ||
                   !bVar22) || !bVar21) || !bVar20) || !bVar19) || !bVar18) || !bVar17) || !bVar16)
            || !bVar15) || !bVar10) || !bVar41;
  uVar60 = (-1 < (short)uVar60) * uVar60;
  uVar64 = (-1 < (short)uVar64) * uVar64;
  uVar65 = (-1 < (short)uVar65) * uVar65;
  uVar66 = (-1 < (short)uVar66) * uVar66;
  uVar67 = (-1 < (short)uVar67) * uVar67;
  uVar68 = (-1 < (short)uVar68) * uVar68;
  uVar69 = (-1 < (short)uVar69) * uVar69;
  uVar70 = (-1 < (short)uVar70) * uVar70;
  *(short *)(dqcoeff_ptr + 4) = sVar135;
  *(undefined2 *)((long)dqcoeff_ptr + 0x12) = uVar122;
  *(short *)(dqcoeff_ptr + 5) = auVar128._10_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x16) = uVar124;
  *(short *)(dqcoeff_ptr + 6) = auVar90._12_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x1a) = uVar125;
  *(short *)(dqcoeff_ptr + 7) = auVar90._14_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x1e) = uVar126;
  *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar72;
  *(short *)(dqcoeff_ptr + 0xc) = sVar169;
  *(undefined2 *)((long)dqcoeff_ptr + 0x32) = uVar149;
  *(short *)(dqcoeff_ptr + 0xd) = auVar158._10_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x36) = uVar150;
  *(short *)(dqcoeff_ptr + 0xe) = auVar91._12_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x3a) = uVar151;
  *(short *)(dqcoeff_ptr + 0xf) = auVar91._14_2_;
  *(undefined2 *)((long)dqcoeff_ptr + 0x3e) = uVar152;
  if (0x10 < n_coeffs) {
    iVar38 = 0x10;
    lVar42 = 0x10;
    bVar10 = bVar41;
    do {
      bVar41 = bVar10;
      lVar40 = (long)iVar38;
      while( true ) {
        iVar38 = iVar38 + 0x10;
        auVar43 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar42),
                           *(undefined1 (*) [16])(coeff_ptr + lVar42 + 4));
        auVar50 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar42 + 8),
                           *(undefined1 (*) [16])(coeff_ptr + lVar42 + 0xc));
        uVar173 = 0;
        uVar177 = 0;
        uVar178 = 0;
        uVar179 = 0;
        uVar180 = 0;
        uVar181 = 0;
        uVar182 = 0;
        uVar183 = 0;
        sVar133 = auVar43._0_2_;
        sVar135 = -sVar133;
        sVar134 = auVar43._2_2_;
        auVar128._10_2_ = -sVar134;
        sVar166 = auVar43._4_2_;
        sVar169 = -sVar166;
        sVar167 = auVar43._6_2_;
        auVar158._10_2_ = -sVar167;
        auVar90._12_2_ = auVar43._8_2_;
        auVar91._12_2_ = -auVar90._12_2_;
        auVar90._14_2_ = auVar43._10_2_;
        auVar91._14_2_ = -auVar90._14_2_;
        sVar168 = auVar43._12_2_;
        sVar127 = -sVar168;
        sVar136 = auVar43._14_2_;
        sVar132 = -sVar136;
        uVar88 = (ushort)(sVar135 < sVar133) * sVar133 | (ushort)(sVar135 >= sVar133) * sVar135;
        uVar119 = (ushort)(auVar128._10_2_ < sVar134) * sVar134 |
                  (ushort)(auVar128._10_2_ >= sVar134) * auVar128._10_2_;
        uVar120 = (ushort)(sVar169 < sVar166) * sVar166 | (ushort)(sVar169 >= sVar166) * sVar169;
        uVar121 = (ushort)(auVar158._10_2_ < sVar167) * sVar167 |
                  (ushort)(auVar158._10_2_ >= sVar167) * auVar158._10_2_;
        uVar89 = CONCAT26(uVar121,CONCAT24(uVar120,CONCAT22(uVar119,uVar88)));
        uVar123 = (ushort)(auVar91._12_2_ < auVar90._12_2_) * auVar90._12_2_ |
                  (ushort)(auVar91._12_2_ >= auVar90._12_2_) * auVar91._12_2_;
        auVar104._0_10_ = CONCAT28(uVar123,uVar89);
        auVar104._10_2_ =
             (ushort)(auVar91._14_2_ < auVar90._14_2_) * auVar90._14_2_ |
             (ushort)(auVar91._14_2_ >= auVar90._14_2_) * auVar91._14_2_;
        auVar104._12_2_ =
             (ushort)(sVar127 < sVar168) * sVar168 | (ushort)(sVar127 >= sVar168) * sVar127;
        auVar104._14_2_ =
             (ushort)(sVar132 < sVar136) * sVar136 | (ushort)(sVar132 >= sVar136) * sVar132;
        sVar133 = auVar50._0_2_;
        sVar135 = -sVar133;
        sVar134 = auVar50._2_2_;
        auVar128._10_2_ = -sVar134;
        sVar166 = auVar50._4_2_;
        sVar169 = -sVar166;
        sVar167 = auVar50._6_2_;
        auVar158._10_2_ = -sVar167;
        auVar90._12_2_ = auVar50._8_2_;
        auVar91._12_2_ = -auVar90._12_2_;
        auVar90._14_2_ = auVar50._10_2_;
        auVar91._14_2_ = -auVar90._14_2_;
        sVar168 = auVar50._12_2_;
        sVar127 = -sVar168;
        sVar136 = auVar50._14_2_;
        sVar132 = -sVar136;
        uVar147 = (ushort)(sVar135 < sVar133) * sVar133 | (ushort)(sVar135 >= sVar133) * sVar135;
        uVar148 = (ushort)(auVar128._10_2_ < sVar134) * sVar134 |
                  (ushort)(auVar128._10_2_ >= sVar134) * auVar128._10_2_;
        uVar54 = (ushort)(sVar169 < sVar166) * sVar166 | (ushort)(sVar169 >= sVar166) * sVar169;
        uVar56 = (ushort)(auVar158._10_2_ < sVar167) * sVar167 |
                 (ushort)(auVar158._10_2_ >= sVar167) * auVar158._10_2_;
        uVar49 = CONCAT26(uVar56,CONCAT24(uVar54,CONCAT22(uVar148,uVar147)));
        uVar58 = (ushort)(auVar91._12_2_ < auVar90._12_2_) * auVar90._12_2_ |
                 (ushort)(auVar91._12_2_ >= auVar90._12_2_) * auVar91._12_2_;
        auVar51._0_10_ = CONCAT28(uVar58,uVar49);
        auVar51._10_2_ =
             (ushort)(auVar91._14_2_ < auVar90._14_2_) * auVar90._14_2_ |
             (ushort)(auVar91._14_2_ >= auVar90._14_2_) * auVar91._14_2_;
        auVar51._12_2_ =
             (ushort)(sVar127 < sVar168) * sVar168 | (ushort)(sVar127 >= sVar168) * sVar127;
        auVar51._14_2_ =
             (ushort)(sVar132 < sVar136) * sVar136 | (ushort)(sVar132 >= sVar136) * sVar132;
        auVar4._10_2_ = 0;
        auVar4._0_10_ = auVar104._0_10_;
        auVar4._12_2_ = uVar121;
        auVar8._8_2_ = uVar120;
        auVar8._0_8_ = uVar89;
        auVar8._10_4_ = auVar4._10_4_;
        auVar31._6_8_ = 0;
        auVar31._0_6_ = auVar8._8_6_;
        auVar13._4_2_ = uVar119;
        auVar13._0_4_ = CONCAT22(uVar119,uVar88);
        auVar13._6_8_ = SUB148(auVar31 << 0x40,6);
        auVar5._10_2_ = 0;
        auVar5._0_10_ = auVar51._0_10_;
        auVar5._12_2_ = uVar56;
        auVar9._8_2_ = uVar54;
        auVar9._0_8_ = uVar49;
        auVar9._10_4_ = auVar5._10_4_;
        auVar32._6_8_ = 0;
        auVar32._0_6_ = auVar9._8_6_;
        auVar14._4_2_ = uVar148;
        auVar14._0_4_ = CONCAT22(uVar148,uVar147);
        auVar14._6_8_ = SUB148(auVar32 << 0x40,6);
        auVar171._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar88 << 5));
        auVar171._4_4_ = -(uint)(aiStack_74[0] < auVar13._4_4_ << 5);
        auVar171._8_4_ = -(uint)(aiStack_74[0] < auVar8._8_4_ << 5);
        auVar171._12_4_ = -(uint)(aiStack_74[0] < (int)((auVar4._10_4_ >> 0x10) << 5));
        auVar162._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar123 << 5));
        auVar162._4_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar104._10_2_ << 5));
        auVar162._8_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar104._12_2_ << 5));
        auVar162._12_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar104._14_2_ << 5));
        auVar62 = packssdw(auVar171,auVar162);
        auVar175._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar147 << 5));
        auVar175._4_4_ = -(uint)(aiStack_74[0] < auVar14._4_4_ << 5);
        auVar175._8_4_ = -(uint)(aiStack_74[0] < auVar9._8_4_ << 5);
        auVar175._12_4_ = -(uint)(aiStack_74[0] < (int)((auVar5._10_4_ >> 0x10) << 5));
        auVar153._0_4_ = -(uint)(aiStack_74[0] < (int)((uint)uVar58 << 5));
        auVar153._4_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar51._10_2_ << 5));
        auVar153._8_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar51._12_2_ << 5));
        auVar153._12_4_ = -(uint)(aiStack_74[0] < (int)((uint)auVar51._14_2_ << 5));
        auVar72 = packssdw(auVar175,auVar153);
        auVar59 = auVar72 | auVar62;
        if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar59[0xf] < '\0') {
          auVar62 = auVar62 & *(undefined1 (*) [16])(iscan + lVar42);
          auVar72 = auVar72 & *(undefined1 (*) [16])(iscan + lVar42 + 8);
          sVar135 = auVar62._0_2_;
          auVar128._10_2_ = auVar72._0_2_;
          uVar173 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._2_2_;
          auVar128._10_2_ = auVar72._2_2_;
          uVar177 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._4_2_;
          auVar128._10_2_ = auVar72._4_2_;
          uVar178 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._6_2_;
          auVar128._10_2_ = auVar72._6_2_;
          uVar179 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._8_2_;
          auVar128._10_2_ = auVar72._8_2_;
          uVar180 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._10_2_;
          auVar128._10_2_ = auVar72._10_2_;
          uVar181 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._12_2_;
          auVar128._10_2_ = auVar72._12_2_;
          sVar169 = auVar72._14_2_;
          uVar182 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                    (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
          sVar135 = auVar62._14_2_;
          uVar183 = (ushort)(sVar169 < sVar135) * sVar135 | (ushort)(sVar169 >= sVar135) * sVar169;
          bVar33 = true;
        }
        uVar60 = ((short)uVar60 < (short)uVar173) * uVar173 |
                 ((short)uVar60 >= (short)uVar173) * uVar60;
        uVar64 = ((short)uVar64 < (short)uVar177) * uVar177 |
                 ((short)uVar64 >= (short)uVar177) * uVar64;
        uVar65 = ((short)uVar65 < (short)uVar178) * uVar178 |
                 ((short)uVar65 >= (short)uVar178) * uVar65;
        uVar66 = ((short)uVar66 < (short)uVar179) * uVar179 |
                 ((short)uVar66 >= (short)uVar179) * uVar66;
        uVar67 = ((short)uVar67 < (short)uVar180) * uVar180 |
                 ((short)uVar67 >= (short)uVar180) * uVar67;
        uVar68 = ((short)uVar68 < (short)uVar181) * uVar181 |
                 ((short)uVar68 >= (short)uVar181) * uVar68;
        uVar69 = ((short)uVar69 < (short)uVar182) * uVar182 |
                 ((short)uVar69 >= (short)uVar182) * uVar69;
        uVar70 = ((short)uVar70 < (short)uVar183) * uVar183 |
                 ((short)uVar70 >= (short)uVar183) * uVar70;
        auVar172._0_2_ = -(ushort)(sVar44 < (short)uVar88);
        auVar172._2_2_ = -(ushort)(sVar45 < (short)uVar119);
        auVar172._4_2_ = -(ushort)(sVar46 < (short)uVar120);
        auVar172._6_2_ = -(ushort)(sVar47 < (short)uVar121);
        auVar172._8_2_ = -(ushort)(sVar44 < (short)uVar123);
        auVar172._10_2_ = -(ushort)(sVar45 < (short)auVar104._10_2_);
        auVar172._12_2_ = -(ushort)(sVar46 < (short)auVar104._12_2_);
        auVar172._14_2_ = -(ushort)(sVar47 < (short)auVar104._14_2_);
        auVar176._0_2_ = -(ushort)(sVar44 < (short)uVar147);
        auVar176._2_2_ = -(ushort)(sVar45 < (short)uVar148);
        auVar176._4_2_ = -(ushort)(sVar46 < (short)uVar54);
        auVar176._6_2_ = -(ushort)(sVar47 < (short)uVar56);
        auVar176._8_2_ = -(ushort)(sVar44 < (short)uVar58);
        auVar176._10_2_ = -(ushort)(sVar45 < (short)auVar51._10_2_);
        auVar176._12_2_ = -(ushort)(sVar46 < (short)auVar51._12_2_);
        auVar176._14_2_ = -(ushort)(sVar47 < (short)auVar51._14_2_);
        auVar59 = auVar176 | auVar172;
        if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar59 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar59[0xf] < '\0') break;
        uVar52 = (-1 < (short)uVar52) * uVar52;
        uVar48 = (-1 < (short)uVar48) * uVar48;
        uVar53 = (-1 < (short)uVar53) * uVar53;
        uVar55 = (-1 < (short)uVar55) * uVar55;
        uVar57 = (-1 < (short)uVar57) * uVar57;
        uVar137 = (-1 < (short)uVar137) * uVar137;
        uVar145 = (-1 < (short)uVar145) * uVar145;
        uVar146 = (-1 < (short)uVar146) * uVar146;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42) = (undefined1  [16])0x0;
        lVar40 = lVar40 + 0x10;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42) = (undefined1  [16])0x0;
        lVar42 = lVar40;
        if (n_coeffs <= lVar40) goto LAB_0031d094;
      }
      auVar59 = psraw(auVar43,0xf);
      auVar62 = psraw(auVar50,0xf);
      auVar50 = *(undefined1 (*) [16])(iscan + lVar42) & auVar172;
      auVar43 = *(undefined1 (*) [16])(iscan + lVar42 + 8) & auVar176;
      sVar135 = auVar50._0_2_;
      auVar128._10_2_ = auVar43._0_2_;
      uVar147 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._2_2_;
      auVar128._10_2_ = auVar43._2_2_;
      uVar148 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._4_2_;
      auVar128._10_2_ = auVar43._4_2_;
      uVar54 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
               (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._6_2_;
      auVar128._10_2_ = auVar43._6_2_;
      uVar56 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
               (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._8_2_;
      auVar128._10_2_ = auVar43._8_2_;
      uVar58 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
               (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._10_2_;
      auVar128._10_2_ = auVar43._10_2_;
      uVar173 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._12_2_;
      auVar128._10_2_ = auVar43._12_2_;
      sVar169 = auVar43._14_2_;
      uVar177 = (ushort)(auVar128._10_2_ < sVar135) * sVar135 |
                (ushort)(auVar128._10_2_ >= sVar135) * auVar128._10_2_;
      sVar135 = auVar50._14_2_;
      uVar178 = (ushort)(sVar169 < sVar135) * sVar135 | (ushort)(sVar169 >= sVar135) * sVar169;
      uVar52 = ((short)uVar147 < (short)uVar52) * uVar52 |
               ((short)uVar147 >= (short)uVar52) * uVar147;
      uVar48 = ((short)uVar148 < (short)uVar48) * uVar48 |
               ((short)uVar148 >= (short)uVar48) * uVar148;
      uVar53 = ((short)uVar54 < (short)uVar53) * uVar53 | ((short)uVar54 >= (short)uVar53) * uVar54;
      uVar55 = ((short)uVar56 < (short)uVar55) * uVar55 | ((short)uVar56 >= (short)uVar55) * uVar56;
      uVar57 = ((short)uVar58 < (short)uVar57) * uVar57 | ((short)uVar58 >= (short)uVar57) * uVar58;
      uVar137 = ((short)uVar173 < (short)uVar137) * uVar137 |
                ((short)uVar173 >= (short)uVar137) * uVar173;
      uVar145 = ((short)uVar177 < (short)uVar145) * uVar145 |
                ((short)uVar177 >= (short)uVar145) * uVar177;
      uVar146 = ((short)uVar178 < (short)uVar146) * uVar146 |
                ((short)uVar178 >= (short)uVar146) * uVar178;
      auVar50 = paddsw(auVar104,auVar77);
      auVar43 = pmulhw(auVar50,auVar78);
      auVar79._0_2_ = auVar43._0_2_ + auVar50._0_2_;
      auVar79._2_2_ = auVar43._2_2_ + auVar50._2_2_;
      auVar79._4_2_ = auVar43._4_2_ + auVar50._4_2_;
      auVar79._6_2_ = auVar43._6_2_ + auVar50._6_2_;
      auVar79._8_2_ = auVar43._8_2_ + auVar50._8_2_;
      auVar79._10_2_ = auVar43._10_2_ + auVar50._10_2_;
      auVar79._12_2_ = auVar43._12_2_ + auVar50._12_2_;
      auVar79._14_2_ = auVar43._14_2_ + auVar50._14_2_;
      auVar50 = pmulhw(auVar79,auVar63);
      auVar43 = paddsw(auVar51,auVar77);
      auVar72 = pmulhw(auVar43,auVar78);
      auVar163._0_2_ = auVar72._0_2_ + auVar43._0_2_;
      auVar163._2_2_ = auVar72._2_2_ + auVar43._2_2_;
      auVar163._4_2_ = auVar72._4_2_ + auVar43._4_2_;
      auVar163._6_2_ = auVar72._6_2_ + auVar43._6_2_;
      auVar163._8_2_ = auVar72._8_2_ + auVar43._8_2_;
      auVar163._10_2_ = auVar72._10_2_ + auVar43._10_2_;
      auVar163._12_2_ = auVar72._12_2_ + auVar43._12_2_;
      auVar163._14_2_ = auVar72._14_2_ + auVar43._14_2_;
      auVar43 = pmulhw(auVar163,auVar63);
      auVar50 = auVar50 ^ auVar59;
      auVar80._0_2_ = auVar50._0_2_ - auVar59._0_2_;
      auVar80._2_2_ = auVar50._2_2_ - auVar59._2_2_;
      auVar80._4_2_ = auVar50._4_2_ - auVar59._4_2_;
      auVar80._6_2_ = auVar50._6_2_ - auVar59._6_2_;
      auVar80._8_2_ = auVar50._8_2_ - auVar59._8_2_;
      auVar80._10_2_ = auVar50._10_2_ - auVar59._10_2_;
      auVar80._12_2_ = auVar50._12_2_ - auVar59._12_2_;
      auVar80._14_2_ = auVar50._14_2_ - auVar59._14_2_;
      auVar43 = auVar43 ^ auVar62;
      auVar164._0_2_ = auVar43._0_2_ - auVar62._0_2_;
      auVar164._2_2_ = auVar43._2_2_ - auVar62._2_2_;
      auVar164._4_2_ = auVar43._4_2_ - auVar62._4_2_;
      auVar164._6_2_ = auVar43._6_2_ - auVar62._6_2_;
      auVar164._8_2_ = auVar43._8_2_ - auVar62._8_2_;
      auVar164._10_2_ = auVar43._10_2_ - auVar62._10_2_;
      auVar164._12_2_ = auVar43._12_2_ - auVar62._12_2_;
      auVar164._14_2_ = auVar43._14_2_ - auVar62._14_2_;
      auVar80 = auVar80 & auVar172;
      auVar164 = auVar164 & auVar176;
      auVar43 = psraw(auVar80,0xf);
      auVar108._0_12_ = auVar80._0_12_;
      auVar108._12_2_ = auVar80._6_2_;
      auVar108._14_2_ = auVar43._6_2_;
      auVar107._12_4_ = auVar108._12_4_;
      auVar107._0_10_ = auVar80._0_10_;
      auVar107._10_2_ = auVar43._4_2_;
      auVar106._10_6_ = auVar107._10_6_;
      auVar106._0_8_ = auVar80._0_8_;
      auVar106._8_2_ = auVar80._4_2_;
      auVar105._8_8_ = auVar106._8_8_;
      auVar105._6_2_ = auVar43._2_2_;
      auVar105._4_2_ = auVar80._2_2_;
      auVar105._0_2_ = auVar80._0_2_;
      auVar105._2_2_ = auVar43._0_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar42) = auVar105;
      ptVar1 = qcoeff_ptr + lVar42 + 4;
      *(short *)ptVar1 = auVar80._8_2_;
      *(short *)((long)ptVar1 + 2) = auVar43._8_2_;
      *(short *)(ptVar1 + 1) = auVar80._10_2_;
      *(short *)((long)ptVar1 + 6) = auVar43._10_2_;
      *(short *)(ptVar1 + 2) = auVar80._12_2_;
      *(short *)((long)ptVar1 + 10) = auVar43._12_2_;
      *(short *)(ptVar1 + 3) = auVar80._14_2_;
      *(short *)((long)ptVar1 + 0xe) = auVar43._14_2_;
      auVar43 = psraw(auVar164,0xf);
      auVar112._0_12_ = auVar164._0_12_;
      auVar112._12_2_ = auVar164._6_2_;
      auVar112._14_2_ = auVar43._6_2_;
      auVar111._12_4_ = auVar112._12_4_;
      auVar111._0_10_ = auVar164._0_10_;
      auVar111._10_2_ = auVar43._4_2_;
      auVar110._10_6_ = auVar111._10_6_;
      auVar110._0_8_ = auVar164._0_8_;
      auVar110._8_2_ = auVar164._4_2_;
      auVar109._8_8_ = auVar110._8_8_;
      auVar109._6_2_ = auVar43._2_2_;
      auVar109._4_2_ = auVar164._2_2_;
      auVar109._0_2_ = auVar164._0_2_;
      auVar109._2_2_ = auVar43._0_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 8) = auVar109;
      ptVar1 = qcoeff_ptr + lVar42 + 0xc;
      *(short *)ptVar1 = auVar164._8_2_;
      *(short *)((long)ptVar1 + 2) = auVar43._8_2_;
      *(short *)(ptVar1 + 1) = auVar164._10_2_;
      *(short *)((long)ptVar1 + 6) = auVar43._10_2_;
      *(short *)(ptVar1 + 2) = auVar164._12_2_;
      *(short *)((long)ptVar1 + 10) = auVar43._12_2_;
      *(short *)(ptVar1 + 3) = auVar164._14_2_;
      *(short *)((long)ptVar1 + 0xe) = auVar43._14_2_;
      sVar135 = auVar80._2_2_ * sVar61;
      uVar73 = CONCAT22(sVar135,auVar105._0_2_ * sVar154);
      auVar128._10_2_ = auVar80._4_2_ * sVar71;
      uVar74 = CONCAT24(auVar128._10_2_,uVar73);
      sVar169 = auVar80._6_2_ * sVar155;
      uVar49 = CONCAT26(sVar169,uVar74);
      auVar158._10_2_ = auVar80._8_2_ * sVar154;
      auVar75._0_10_ = CONCAT28(auVar158._10_2_,uVar49);
      auVar75._10_2_ = auVar80._10_2_ * sVar61;
      auVar81._12_2_ = auVar80._12_2_ * sVar71;
      auVar81._0_12_ = auVar75;
      auVar81._14_2_ = auVar80._14_2_ * sVar155;
      auVar91._12_2_ = auVar164._2_2_ * sVar61;
      uVar156 = CONCAT22(auVar91._12_2_,auVar109._0_2_ * sVar154);
      auVar91._14_2_ = auVar164._4_2_ * sVar71;
      uVar157 = CONCAT24(auVar91._14_2_,uVar156);
      sVar127 = auVar164._6_2_ * sVar155;
      uVar89 = CONCAT26(sVar127,uVar157);
      sVar132 = auVar164._8_2_ * sVar154;
      auVar159._0_10_ = CONCAT28(sVar132,uVar89);
      auVar159._10_2_ = auVar164._10_2_ * sVar61;
      auVar165._12_2_ = auVar164._12_2_ * sVar71;
      auVar165._0_12_ = auVar159;
      auVar165._14_2_ = auVar164._14_2_ * sVar155;
      auVar43 = psraw(auVar81,0xf);
      auVar118._12_2_ = sVar169;
      auVar118._0_12_ = auVar75;
      auVar118._14_2_ = auVar43._6_2_;
      auVar117._12_4_ = auVar118._12_4_;
      auVar117._10_2_ = auVar43._4_2_;
      auVar117._0_10_ = auVar75._0_10_;
      auVar116._10_6_ = auVar117._10_6_;
      auVar116._8_2_ = auVar128._10_2_;
      auVar116._0_8_ = uVar49;
      auVar115._8_8_ = auVar116._8_8_;
      auVar115._6_2_ = auVar43._2_2_;
      auVar115._0_6_ = uVar74;
      auVar114._6_10_ = auVar115._6_10_;
      auVar114._4_2_ = sVar135;
      auVar114._0_4_ = uVar73;
      auVar113._4_12_ = auVar114._4_12_;
      auVar113._2_2_ = auVar43._0_2_;
      auVar113._0_2_ = auVar105._0_2_ * sVar154;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar42) = auVar113;
      ptVar1 = dqcoeff_ptr + lVar42 + 4;
      *(short *)ptVar1 = auVar158._10_2_;
      *(short *)((long)ptVar1 + 2) = auVar43._8_2_;
      *(short *)(ptVar1 + 1) = auVar75._10_2_;
      *(short *)((long)ptVar1 + 6) = auVar43._10_2_;
      *(short *)(ptVar1 + 2) = auVar81._12_2_;
      *(short *)((long)ptVar1 + 10) = auVar43._12_2_;
      *(short *)(ptVar1 + 3) = auVar81._14_2_;
      *(short *)((long)ptVar1 + 0xe) = auVar43._14_2_;
      auVar43 = psraw(auVar165,0xf);
      auVar87._12_2_ = sVar127;
      auVar87._0_12_ = auVar159;
      auVar87._14_2_ = auVar43._6_2_;
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._10_2_ = auVar43._4_2_;
      auVar86._0_10_ = auVar159._0_10_;
      auVar85._10_6_ = auVar86._10_6_;
      auVar85._8_2_ = auVar91._14_2_;
      auVar85._0_8_ = uVar89;
      auVar84._8_8_ = auVar85._8_8_;
      auVar84._6_2_ = auVar43._2_2_;
      auVar84._0_6_ = uVar157;
      auVar83._6_10_ = auVar84._6_10_;
      auVar83._4_2_ = auVar91._12_2_;
      auVar83._0_4_ = uVar156;
      auVar82._4_12_ = auVar83._4_12_;
      auVar82._2_2_ = auVar43._0_2_;
      auVar82._0_2_ = auVar109._0_2_ * sVar154;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar42 + 8) = auVar82;
      ptVar1 = dqcoeff_ptr + lVar42 + 0xc;
      *(short *)ptVar1 = sVar132;
      *(short *)((long)ptVar1 + 2) = auVar43._8_2_;
      *(short *)(ptVar1 + 1) = auVar159._10_2_;
      *(short *)((long)ptVar1 + 6) = auVar43._10_2_;
      *(short *)(ptVar1 + 2) = auVar165._12_2_;
      *(short *)((long)ptVar1 + 10) = auVar43._12_2_;
      *(short *)(ptVar1 + 3) = auVar165._14_2_;
      *(short *)((long)ptVar1 + 0xe) = auVar43._14_2_;
      lVar42 = (long)iVar38;
      bVar41 = true;
      bVar10 = true;
    } while (lVar42 < n_coeffs);
  }
LAB_0031d094:
  if (bVar33) {
    uVar67 = ((short)uVar67 < (short)uVar60) * uVar60 | ((short)uVar67 >= (short)uVar60) * uVar67;
    uVar68 = ((short)uVar68 < (short)uVar64) * uVar64 | ((short)uVar68 >= (short)uVar64) * uVar68;
    uVar69 = ((short)uVar69 < (short)uVar65) * uVar65 | ((short)uVar69 >= (short)uVar65) * uVar69;
    uVar66 = ((short)uVar70 < (short)uVar66) * uVar66 | ((short)uVar70 >= (short)uVar66) * uVar70;
    uVar70 = ((short)uVar69 < (short)uVar67) * uVar67 | ((short)uVar69 >= (short)uVar67) * uVar69;
    uVar69 = ((short)uVar66 < (short)uVar68) * uVar68 | ((short)uVar66 >= (short)uVar68) * uVar66;
    uVar37 = (ushort)(((short)uVar69 < (short)uVar70) * uVar70 |
                     ((short)uVar69 >= (short)uVar70) * uVar69) + 1;
  }
  else {
    uVar37 = 0;
  }
  if (bVar41) {
    uVar70 = ((short)uVar57 < (short)uVar52) * uVar52 | ((short)uVar57 >= (short)uVar52) * uVar57;
    uVar69 = ((short)uVar137 < (short)uVar48) * uVar48 | ((short)uVar137 >= (short)uVar48) * uVar137
    ;
    uVar68 = ((short)uVar145 < (short)uVar53) * uVar53 | ((short)uVar145 >= (short)uVar53) * uVar145
    ;
    uVar67 = ((short)uVar146 < (short)uVar55) * uVar55 | ((short)uVar146 >= (short)uVar55) * uVar146
    ;
    uVar70 = ((short)uVar68 < (short)uVar70) * uVar70 | ((short)uVar68 >= (short)uVar70) * uVar68;
    uVar69 = ((short)uVar67 < (short)uVar69) * uVar69 | ((short)uVar67 >= (short)uVar69) * uVar67;
    uVar36 = (uint)(ushort)(((short)uVar69 < (short)uVar70) * uVar70 |
                           ((short)uVar69 >= (short)uVar70) * uVar69);
  }
  else {
    uVar36 = 0xffffffff;
  }
  if ((int)uVar37 <= (int)uVar36) {
    iVar38 = uVar36 + 1;
    psVar34 = scan + uVar36;
    do {
      sVar154 = *psVar34;
      qcoeff_ptr[sVar154] = 0;
      dqcoeff_ptr[sVar154] = 0;
      iVar38 = iVar38 + -1;
      psVar34 = psVar34 + -1;
    } while ((int)uVar37 < iVar38);
  }
  iVar38 = uVar37 + 1;
  uVar35 = (ulong)uVar37;
  do {
    if ((long)uVar35 < 1) {
      uVar70 = 0;
      break;
    }
    lVar42 = uVar35 - 1;
    uVar35 = uVar35 - 1;
    iVar38 = iVar38 + -1;
    uVar70 = (ushort)iVar38;
  } while (qcoeff_ptr[scan[lVar42]] == 0);
  *eob_ptr = uVar70;
  uVar36 = 0xffffffff;
  if (uVar37 != 0) {
    uVar35 = 0;
    do {
      if (qcoeff_ptr[scan[uVar35]] != 0) {
        uVar36 = (uint)uVar35;
        break;
      }
      uVar35 = uVar35 + 1;
    } while (uVar37 != uVar35);
  }
  if ((uVar70 != 0) && (uVar36 == uVar70 - 1)) {
    sVar154 = scan[uVar36];
    if (((qcoeff_ptr[sVar154] == 1) || (qcoeff_ptr[sVar154] == -1)) &&
       (uVar37 = coeff_ptr[sVar154] >> 0x1f, uVar35 = (ulong)((uint)(sVar154 != 0) * 2),
       (int)((coeff_ptr[sVar154] << 5 ^ uVar37) - uVar37) <
       *(short *)((long)zbin_ptr + uVar35) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar35) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar154] = 0;
      dqcoeff_ptr[sVar154] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  // Poor man's abs().
  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff(&qcoeff0, round, quant, shift);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);

    calculate_qcoeff(&qcoeff1, round, quant, shift);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr);
    store_coefficients(coeff1, dqcoeff_ptr + 8);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr + index);
    store_coefficients(coeff1, dqcoeff_ptr + index + 8);

    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}